

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
DoublesEqualFailure::DoublesEqualFailure
          (DoublesEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          double expected,double actual,double threshold,SimpleString *text)

{
  SimpleString *this_00;
  int iVar1;
  SimpleString *expected_00;
  undefined1 local_60 [72];
  
  local_60._16_8_ = threshold;
  local_60._24_8_ = actual;
  local_60._32_8_ = expected;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0015f898;
  TestFailure::createUserText((TestFailure *)local_60,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  StringFrom((double)local_60._32_8_,(int)local_60 + 0x38);
  expected_00 = (SimpleString *)0x7;
  StringFrom((double)local_60._24_8_,(int)local_60 + 0x28);
  TestFailure::createButWasString
            ((TestFailure *)local_60,expected_00,(SimpleString *)(local_60 + 0x38));
  SimpleString::operator+=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x28));
  SimpleString::~SimpleString((SimpleString *)(local_60 + 0x38));
  SimpleString::operator+=(this_00," threshold used was <");
  StringFrom((double)local_60._16_8_,(int)local_60);
  SimpleString::operator+=(this_00,(SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::operator+=(this_00,">");
  iVar1 = (*PlatformSpecificIsNan)((double)local_60._32_8_);
  if (((iVar1 == 0) && (iVar1 = (*PlatformSpecificIsNan)((double)local_60._24_8_), iVar1 == 0)) &&
     (iVar1 = (*PlatformSpecificIsNan)((double)local_60._16_8_), iVar1 == 0)) {
    return;
  }
  SimpleString::operator+=(this_00,"\n\tCannot make comparisons with Nan");
  return;
}

Assistant:

DoublesEqualFailure::DoublesEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, double expected, double actual, double threshold, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFrom(expected, 7), StringFrom(actual, 7));
    message_ += " threshold used was <";
    message_ += StringFrom(threshold, 7);
    message_ += ">";

    if (PlatformSpecificIsNan(expected) || PlatformSpecificIsNan(actual) || PlatformSpecificIsNan(threshold))
        message_ += "\n\tCannot make comparisons with Nan";
}